

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

aphy_error aphyGetEngines(aphy_size numengines,aphy_engine **engines,aphy_size *ret_numengines)

{
  undefined8 *puVar1;
  aphy_engine *paVar2;
  
  if (ret_numengines != (aphy_size *)0x0) {
    *ret_numengines = 1;
  }
  if (numengines != 0 && engines != (aphy_engine **)0x0) {
    puVar1 = (undefined8 *)operator_new(0x10);
    *puVar1 = &PTR__BulletEngine_0021a780;
    paVar2 = (aphy_engine *)operator_new(0x18);
    *(undefined1 **)paVar2 = aphy::cppRefcountedDispatchTable;
    *(undefined8 **)(paVar2 + 8) = puVar1;
    *(undefined8 *)(paVar2 + 0x10) = 1;
    puVar1[1] = paVar2;
    *engines = paVar2;
  }
  return APHY_OK;
}

Assistant:

APHY_EXPORT aphy_error aphyGetEngines ( aphy_size numengines, aphy_engine** engines, aphy_size* ret_numengines )
{
    using namespace aphy;
    using namespace APhyBullet;

    if(ret_numengines)
        *ret_numengines = 1;

    if(engines && numengines >= 1)
        engines[0] = reinterpret_cast<aphy_engine* > (makeObject<BulletEngine> ().disown());

    return APHY_OK;
}